

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

void tcg_commit(MemoryListener *listener)

{
  cpu_reloading_memory_map_tricore();
  listener[-1].link_as.tqe_circ.tql_prev =
       *(QTailQLink **)((listener[-1].link_as.tqe_next)->commit + 0x18);
  tlb_flush_tricore((CPUState *)listener[-1].link.tqe_circ.tql_prev);
  return;
}

Assistant:

static void tcg_commit(MemoryListener *listener)
{
    CPUAddressSpace *cpuas;
    AddressSpaceDispatch *d;

    /* since each CPU stores ram addresses in its TLB cache, we must
       reset the modified entries */
    cpuas = container_of(listener, CPUAddressSpace, tcg_as_listener);
    cpu_reloading_memory_map();
    /* The CPU and TLB are protected by the iothread lock.
     * We reload the dispatch pointer now because cpu_reloading_memory_map()
     * may have split the RCU critical section.
     */
    d = address_space_to_dispatch(cpuas->as);
    cpuas->memory_dispatch = d;
    tlb_flush(cpuas->cpu);
}